

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGImpactBvh.cpp
# Opt level: O1

int __thiscall
btBvhTree::_sort_and_calc_splitting_index
          (btBvhTree *this,GIM_BVH_DATA_ARRAY *primitive_boxes,int startIndex,int endIndex,
          int splitAxis)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  GIM_BVH_DATA *pGVar4;
  undefined8 uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  btScalar *pbVar10;
  long lVar11;
  long lVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined8 local_68;
  ulong uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined1 local_30 [16];
  btVector3 center;
  
  fVar14 = 0.0;
  fVar15 = 0.0;
  fVar13 = 0.0;
  lVar11 = (long)startIndex;
  iVar7 = endIndex - startIndex;
  if (iVar7 != 0 && startIndex <= endIndex) {
    pbVar10 = (primitive_boxes->super_btAlignedObjectArray<GIM_BVH_DATA>).m_data[lVar11].m_bound.
              m_max.m_floats + 2;
    lVar12 = endIndex - lVar11;
    do {
      fVar14 = fVar14 + ((float)*(undefined8 *)((btVector3 *)(pbVar10 + -2))->m_floats +
                        (float)*(undefined8 *)(pbVar10 + -6)) * 0.5;
      fVar15 = fVar15 + ((float)((ulong)*(undefined8 *)((btVector3 *)(pbVar10 + -2))->m_floats >>
                                0x20) + (float)((ulong)*(undefined8 *)(pbVar10 + -6) >> 0x20)) * 0.5
      ;
      fVar13 = fVar13 + (*pbVar10 + pbVar10[-4]) * 0.5;
      pbVar10 = pbVar10 + 9;
      lVar12 = lVar12 + -1;
    } while (lVar12 != 0);
  }
  fVar16 = 1.0 / (float)iVar7;
  local_68 = CONCAT44(fVar16 * fVar15,fVar16 * fVar14);
  uStack_60 = (ulong)(uint)(fVar16 * fVar13);
  iVar9 = startIndex;
  if (startIndex < endIndex) {
    fVar13 = *(float *)((long)&local_68 + (long)splitAxis * 4);
    lVar12 = lVar11 * 0x24;
    lVar11 = endIndex - lVar11;
    do {
      pGVar4 = (primitive_boxes->super_btAlignedObjectArray<GIM_BVH_DATA>).m_data;
      uVar2 = *(undefined8 *)((long)(pGVar4->m_bound).m_min.m_floats + lVar12);
      uVar3 = *(undefined8 *)((long)(pGVar4->m_bound).m_max.m_floats + lVar12);
      local_30._4_4_ = ((float)((ulong)uVar3 >> 0x20) + (float)((ulong)uVar2 >> 0x20)) * 0.5;
      local_30._0_4_ = ((float)uVar3 + (float)uVar2) * 0.5;
      local_30._8_4_ =
           (*(float *)((long)(pGVar4->m_bound).m_max.m_floats + lVar12 + 8) +
           *(float *)((long)(pGVar4->m_bound).m_min.m_floats + lVar12 + 8)) * 0.5;
      local_30._12_4_ = 0;
      if (fVar13 < *(float *)(local_30 + (long)splitAxis * 4)) {
        puVar1 = (undefined8 *)((long)(pGVar4->m_bound).m_min.m_floats + lVar12);
        local_58 = *puVar1;
        uStack_50 = puVar1[1];
        local_48 = *(undefined8 *)((long)(pGVar4->m_bound).m_max.m_floats + lVar12);
        uStack_40 = *(undefined8 *)((long)(pGVar4->m_bound).m_max.m_floats + lVar12 + 8);
        iVar6 = *(int *)((long)(&pGVar4->m_bound + 1) + lVar12);
        uVar2 = *(undefined8 *)(pGVar4[iVar9].m_bound.m_min.m_floats + 2);
        uVar3 = *(undefined8 *)pGVar4[iVar9].m_bound.m_max.m_floats;
        uVar5 = *(undefined8 *)(pGVar4[iVar9].m_bound.m_max.m_floats + 2);
        *puVar1 = *(undefined8 *)pGVar4[iVar9].m_bound.m_min.m_floats;
        puVar1[1] = uVar2;
        puVar1[2] = uVar3;
        puVar1[3] = uVar5;
        *(int *)(puVar1 + 4) = pGVar4[iVar9].m_data;
        pGVar4 = (primitive_boxes->super_btAlignedObjectArray<GIM_BVH_DATA>).m_data;
        *(undefined8 *)pGVar4[iVar9].m_bound.m_max.m_floats = local_48;
        *(undefined8 *)(pGVar4[iVar9].m_bound.m_max.m_floats + 2) = uStack_40;
        *(undefined8 *)pGVar4[iVar9].m_bound.m_min.m_floats = local_58;
        *(undefined8 *)(pGVar4[iVar9].m_bound.m_min.m_floats + 2) = uStack_50;
        pGVar4[iVar9].m_data = iVar6;
        iVar9 = iVar9 + 1;
      }
      lVar12 = lVar12 + 0x24;
      lVar11 = lVar11 + -1;
    } while (lVar11 != 0);
  }
  iVar8 = (iVar7 >> 1) + startIndex;
  iVar6 = iVar9;
  if (~(iVar7 / 3) + endIndex <= iVar9) {
    iVar6 = iVar8;
  }
  if (iVar9 <= iVar7 / 3 + startIndex) {
    iVar6 = iVar8;
  }
  return iVar6;
}

Assistant:

int btBvhTree::_sort_and_calc_splitting_index(
	GIM_BVH_DATA_ARRAY & primitive_boxes, int startIndex,
	int endIndex, int splitAxis)
{
	int i;
	int splitIndex =startIndex;
	int numIndices = endIndex - startIndex;

	// average of centers
	btScalar splitValue = 0.0f;

	btVector3 means(btScalar(0.),btScalar(0.),btScalar(0.));
	for (i=startIndex;i<endIndex;i++)
	{
		btVector3 center = btScalar(0.5)*(primitive_boxes[i].m_bound.m_max +
					 primitive_boxes[i].m_bound.m_min);
		means+=center;
	}
	means *= (btScalar(1.)/(btScalar)numIndices);

	splitValue = means[splitAxis];


	//sort leafNodes so all values larger then splitValue comes first, and smaller values start from 'splitIndex'.
	for (i=startIndex;i<endIndex;i++)
	{
		btVector3 center = btScalar(0.5)*(primitive_boxes[i].m_bound.m_max +
					 primitive_boxes[i].m_bound.m_min);
		if (center[splitAxis] > splitValue)
		{
			//swap
			primitive_boxes.swap(i,splitIndex);
			//swapLeafNodes(i,splitIndex);
			splitIndex++;
		}
	}

	//if the splitIndex causes unbalanced trees, fix this by using the center in between startIndex and endIndex
	//otherwise the tree-building might fail due to stack-overflows in certain cases.
	//unbalanced1 is unsafe: it can cause stack overflows
	//bool unbalanced1 = ((splitIndex==startIndex) || (splitIndex == (endIndex-1)));

	//unbalanced2 should work too: always use center (perfect balanced trees)
	//bool unbalanced2 = true;

	//this should be safe too:
	int rangeBalancedIndices = numIndices/3;
	bool unbalanced = ((splitIndex<=(startIndex+rangeBalancedIndices)) || (splitIndex >=(endIndex-1-rangeBalancedIndices)));

	if (unbalanced)
	{
		splitIndex = startIndex+ (numIndices>>1);
	}

	btAssert(!((splitIndex==startIndex) || (splitIndex == (endIndex))));

	return splitIndex;

}